

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_ignore(void)

{
  _Bool _Var1;
  ushort uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  char *message;
  object_kind *poVar5;
  quark_t qVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *ip;
  uint16_t inscriptions;
  uint16_t itype_size;
  uint16_t file_e_max;
  int16_t runeid;
  uint8_t tmp8u;
  bitflag itypes [4];
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  short local_8c;
  byte local_89;
  bitflag local_88 [88];
  
  local_89 = 0x18;
  rd_byte(&local_89);
  if (local_89 == 0x1b) {
    ip = ignore_level;
    sVar7 = 0x1b;
    do {
      rd_byte(ip);
      ip = ip + 1;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  else {
    strip_bytes((uint)local_89);
  }
  rd_u16b(&local_8e);
  rd_u16b(&local_90);
  if (local_90 < 5) {
    if (local_8e != 0) {
      uVar8 = 0;
      uVar2 = local_8e;
      do {
        if (uVar8 < z_info->e_max) {
          rd_byte((uint8_t *)&local_92);
          e_info[uVar8].everseen = (_Bool)((byte)local_92 >> 1 & 1);
          uVar2 = local_8e;
          if (local_90 != 0) {
            uVar9 = 0;
            do {
              rd_byte(local_88 + uVar9);
              uVar9 = uVar9 + 1;
            } while (uVar9 < local_90);
            uVar2 = local_8e;
            if (local_90 == 4) {
              lVar10 = 0;
              do {
                _Var1 = flag_has_dbg(local_88,4,(wchar_t)lVar10,"itypes","j");
                if (_Var1) {
                  ego_ignore_toggle((wchar_t)uVar8,(wchar_t)lVar10);
                }
                lVar10 = lVar10 + 1;
                uVar2 = local_8e;
              } while (lVar10 != 0x1b);
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar2);
    }
    rd_u16b(&local_92);
    if (local_92 != 0) {
      uVar8 = 0;
      do {
        rd_string((char *)local_88,0x50);
        wVar3 = tval_find_idx((char *)local_88);
        rd_string((char *)local_88,0x50);
        wVar3 = wVar3 & 0xff;
        wVar4 = lookup_sval(wVar3,(char *)local_88);
        poVar5 = lookup_kind(wVar3,wVar4 & 0xffU);
        if (poVar5 == (object_kind *)0x0) {
          quit_fmt("lookup_kind(%d, %d) failed",(ulong)(uint)wVar3,(ulong)(uint)(wVar4 & 0xffU));
        }
        rd_string((char *)local_88,0x50);
        qVar6 = quark_add((char *)local_88);
        poVar5->note_aware = qVar6;
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_92);
    }
    rd_u16b(&local_92);
    if (local_92 != 0) {
      uVar8 = 0;
      do {
        rd_string((char *)local_88,0x50);
        wVar3 = tval_find_idx((char *)local_88);
        rd_string((char *)local_88,0x50);
        wVar3 = wVar3 & 0xff;
        wVar4 = lookup_sval(wVar3,(char *)local_88);
        poVar5 = lookup_kind(wVar3,wVar4 & 0xffU);
        if (poVar5 == (object_kind *)0x0) {
          quit_fmt("lookup_kind(%d, %d) failed",(ulong)(uint)wVar3,(ulong)(uint)(wVar4 & 0xffU));
        }
        rd_string((char *)local_88,0x50);
        qVar6 = quark_add((char *)local_88);
        poVar5->note_unaware = qVar6;
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_92);
    }
    rd_u16b(&local_92);
    if (local_92 == 0) {
      wVar3 = L'\0';
    }
    else {
      wVar3 = L'\0';
      uVar8 = 0;
      do {
        rd_s16b(&local_8c);
        rd_string((char *)local_88,0x50);
        rune_set_note((long)local_8c,(char *)local_88);
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_92);
    }
  }
  else {
    message = format("Too many (%u) ignore bytes!");
    note(message);
    wVar3 = L'\xffffffff';
  }
  return wVar3;
}

Assistant:

int rd_ignore(void)
{
	size_t i, j;
	uint8_t tmp8u = 24;
	uint16_t file_e_max;
	uint16_t itype_size;
	uint16_t inscriptions;

	/* Read how many ignore bytes we have */
	rd_byte(&tmp8u);

	/* Check against current number */
	if (tmp8u != ignore_size) {
		strip_bytes(tmp8u);
	} else {
		for (i = 0; i < ignore_size; i++)
			rd_byte(&ignore_level[i]);
	}

	/* Read the number of saved ego-item */
	rd_u16b(&file_e_max);
	rd_u16b(&itype_size);
	if (itype_size > ITYPE_SIZE) {
		note(format("Too many (%u) ignore bytes!", itype_size));
		return (-1);
	}

	for (i = 0; i < file_e_max; i++) {
		if (i < z_info->e_max) {
			bitflag flags, itypes[ITYPE_SIZE];
			
			/* Read and extract the everseen flag */
			rd_byte(&flags);
			e_info[i].everseen = (flags & 0x02) ? true : false;

			/* Read and extract the ignore flags */
			for (j = 0; j < itype_size; j++)
				rd_byte(&itypes[j]);

			/* If number of ignore types has changed, don't set anything */
			if (itype_size == ITYPE_SIZE) {
				for (j = ITYPE_NONE; j < ITYPE_MAX; j++)
					if (itype_has(itypes, j))
						ego_ignore_toggle(i, j);
			}
		}
	}

	/* Read the current number of aware object auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the aware object autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		uint8_t tval, sval;
		struct object_kind *k;

		rd_string(tmp, sizeof(tmp));
		tval = tval_find_idx(tmp);
		rd_string(tmp, sizeof(tmp));
		sval = lookup_sval(tval, tmp);
		k = lookup_kind(tval, sval);
		if (!k)
			quit_fmt("lookup_kind(%d, %d) failed", tval, sval);
		rd_string(tmp, sizeof(tmp));
		k->note_aware = quark_add(tmp);
	}

	/* Read the current number of unaware object auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the unaware object autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		uint8_t tval, sval;
		struct object_kind *k;

		rd_string(tmp, sizeof(tmp));
		tval = tval_find_idx(tmp);
		rd_string(tmp, sizeof(tmp));
		sval = lookup_sval(tval, tmp);
		k = lookup_kind(tval, sval);
		if (!k)
			quit_fmt("lookup_kind(%d, %d) failed", tval, sval);
		rd_string(tmp, sizeof(tmp));
		k->note_unaware = quark_add(tmp);
	}

	/* Read the current number of rune auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the rune autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		int16_t runeid;

		rd_s16b(&runeid);
		rd_string(tmp, sizeof(tmp));
		rune_set_note(runeid, tmp);
	}

	return 0;
}